

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void insert<32768u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_short>,unsigned_short>
               (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *root,uchar **strings
               ,size_t n)

{
  pointer ppvVar1;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *this;
  vector_block<unsigned_char_*,_128U> *this_00;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *pTVar2;
  ushort uVar3;
  uint index;
  size_t depth;
  long lVar5;
  size_t sVar6;
  uchar *str;
  BurstSimple<unsigned_short> local_49;
  uchar *local_48;
  size_t local_40;
  uchar **local_38;
  ulong uVar4;
  
  if (n != 0) {
    sVar6 = 0;
    local_40 = n;
    local_38 = strings;
    do {
      local_48 = local_38[sVar6];
      if (local_48 == (uchar *)0x0) {
LAB_0020fba4:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*local_48 == '\0') {
        uVar3 = 0;
      }
      else {
        uVar3 = CONCAT11(*local_48,local_48[1]);
      }
      uVar4 = (ulong)uVar3;
      index = (uint)uVar3;
      ppvVar1 = (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      depth = 2;
      this = root;
      if (uVar4 < (ulong)((long)(root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3)) {
        lVar5 = 0;
        do {
          if (((ulong)ppvVar1[uVar4] & 1) == 0) break;
          if ((char)uVar3 == '\0') {
            __assert_fail("not is_end(c)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xeb,
                          "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                         );
          }
          this = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_node
                           (this,(uint)uVar4);
          if (local_48 == (uchar *)0x0) goto LAB_0020fba4;
          if (local_48[lVar5 + 2] == '\0') {
            uVar3 = 0;
          }
          else {
            uVar3 = CONCAT11(local_48[lVar5 + 2],local_48[lVar5 + 3]);
          }
          uVar4 = (ulong)uVar3;
          ppvVar1 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 2;
        } while (uVar4 < (ulong)((long)(this->_buckets).
                                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3));
        index = (uint)uVar4;
        depth = lVar5 + 2;
      }
      this_00 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                          (this,index);
      if (this_00 == (vector_block<unsigned_char_*,_128U> *)0x0) {
        __assert_fail("bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xf1,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      vector_block<unsigned_char_*,_128U>::push_back(this_00,&local_48);
      if (((char)uVar3 != '\0') &&
         (0x8000 < ((long)(this_00->_index_block).
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start) * 0x10 -
                   (ulong)this_00->_left_in_block)) {
        pTVar2 = BurstSimple<unsigned_short>::operator()(&local_49,this_00,depth);
        *(TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> **)
         ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + (ulong)((uint)uVar3 * 8)) = pTVar2;
        ppvVar1 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar4 = *(ulong *)((long)ppvVar1 + (ulong)((uint)uVar3 * 8));
        if (uVar4 == 0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x5c,"void make_trie(void *&)");
        }
        ppvVar1[uVar3] = (void *)(uVar4 | 1);
        vector_block<unsigned_char_*,_128U>::~vector_block(this_00);
        operator_delete(this_00);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != local_40);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT, BucketT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT, BucketT>* node = root;
		while (node->is_trie(c)) {
			assert(not is_end(c));
			node = node->get_node(c);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = node->get_bucket(c);
		assert(bucket);
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->_buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			make_trie(node->_buckets[c]);
			delete bucket;
		}
	}
}